

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O1

CoreType helics::core::coreTypeFromString(string_view type)

{
  string_view type_00;
  _Alloc_hider _Var1;
  int iVar2;
  CoreType CVar3;
  const_iterator pvVar4;
  long in_RSI;
  char *in_RDI;
  size_type sVar5;
  string type2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (in_RDI == (char *)0x0) {
    CVar3 = DEFAULT;
  }
  else {
    if (in_RDI[in_RSI + -1] == '_') {
      in_RDI = in_RDI + -1;
    }
    pvVar4 = frozen::
             unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
             ::
             find<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                       ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         *)coreTypes,
                        (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff88
                        ,(elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         (coreTypes + 0x968),
                        (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        coreTypes);
    if (pvVar4 == (const_iterator)(coreTypes + 0x560)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,in_RSI,in_RDI + in_RSI);
      _Var1._M_p = local_68._M_dataplus._M_p;
      if (local_68._M_string_length != 0) {
        sVar5 = 0;
        do {
          iVar2 = tolower((int)_Var1._M_p[sVar5]);
          _Var1._M_p[sVar5] = (byte)iVar2;
          sVar5 = sVar5 + 1;
        } while (local_68._M_string_length != sVar5);
      }
      pvVar4 = frozen::
               unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
               ::
               find<std::__cxx11::string,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                         ((unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::CoreType,57ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
                           *)coreTypes,&local_68,
                          (elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          (coreTypes + 0x968),
                          (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                          coreTypes);
      if (pvVar4 == (const_iterator)(coreTypes + 0x560)) {
        if ((byte)(*local_68._M_dataplus._M_p | 0x10U) == 0x3d) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr(&local_48,&local_68,1,0xffffffffffffffff);
          type_00._M_str = in_RDI;
          type_00._M_len = 0x31e116;
          CVar3 = coreTypeFromString(type_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &stack0xffffffffffffff88,0,5,"zmqss");
          CVar3 = ZMQ_SS;
          if (((iVar2 != 0) &&
              (iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  &stack0xffffffffffffff88,0,6,"zmq_ss"), iVar2 != 0)) &&
             (iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &stack0xffffffffffffff88,0,4,"zmq2"), iVar2 != 0)) {
            iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               &stack0xffffffffffffff88,0,3,"zmq");
            if (iVar2 == 0) {
              CVar3 = ZMQ;
            }
            else {
              iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &stack0xffffffffffffff88,0,3,"ipc");
              if (iVar2 == 0) {
                CVar3 = INTERPROCESS;
              }
              else {
                iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &stack0xffffffffffffff88,0,4,"test");
                if (iVar2 == 0) {
                  CVar3 = TEST;
                }
                else {
                  iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                    ((basic_string_view<char,_std::char_traits<char>_> *)
                                     &stack0xffffffffffffff88,0,5,"tcpss");
                  if (iVar2 == 0) {
                    CVar3 = TCP_SS;
                  }
                  else {
                    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                      ((basic_string_view<char,_std::char_traits<char>_> *)
                                       &stack0xffffffffffffff88,0,3,"tcp");
                    if (iVar2 == 0) {
                      CVar3 = TCP;
                    }
                    else {
                      iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         &stack0xffffffffffffff88,0,3,"udp");
                      if (iVar2 == 0) {
                        CVar3 = UDP;
                      }
                      else {
                        iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                                          ((basic_string_view<char,_std::char_traits<char>_> *)
                                           &stack0xffffffffffffff88,0,4,"http");
                        if (iVar2 == 0) {
                          CVar3 = HTTP;
                        }
                        else {
                          iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                  compare((basic_string_view<char,_std::char_traits<char>_> *)
                                          &stack0xffffffffffffff88,0,3,"mpi");
                          if (iVar2 == 0) {
                            CVar3 = MPI;
                          }
                          else {
                            iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                    compare((basic_string_view<char,_std::char_traits<char>_> *)
                                            &stack0xffffffffffffff88,0,6,"inproc");
                            if (iVar2 == 0) {
                              CVar3 = INPROC;
                            }
                            else {
                              iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                      compare((basic_string_view<char,_std::char_traits<char>_> *)
                                              &stack0xffffffffffffff88,0,3,"web");
                              if (iVar2 == 0) {
                                CVar3 = WEBSOCKET;
                              }
                              else {
                                iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::
                                        compare((basic_string_view<char,_std::char_traits<char>_> *)
                                                &stack0xffffffffffffff88,0,4,"null");
                                CVar3 = UNRECOGNIZED;
                                if (iVar2 == 0) {
                                  CVar3 = NULLCORE;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        CVar3 = pvVar4->second;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      CVar3 = pvVar4->second;
    }
  }
  return CVar3;
}

Assistant:

CoreType coreTypeFromString(std::string_view type) noexcept
{
    if (type.empty()) {
        return CoreType::DEFAULT;
    }
    // in case it came from the to_string(CoreType)
    if (type.back() == '_') {
        type.remove_suffix(1);
    }
    const auto* fnd = coreTypes.find(type);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    std::string type2{type};
    std::transform(type2.cbegin(), type2.cend(), type2.begin(), ::tolower);
    fnd = coreTypes.find(type2);
    if (fnd != coreTypes.end()) {
        return fnd->second;
    }
    if ((type2.front() == '=') || (type2.front() == '-')) {
        return coreTypeFromString(type2.substr(1));
    }
    if (type.compare(0, 5, "zmqss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 6, "zmq_ss") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 4, "zmq2") == 0) {
        return CoreType::ZMQ_SS;
    }
    if (type.compare(0, 3, "zmq") == 0) {
        return CoreType::ZMQ;
    }
    if (type.compare(0, 3, "ipc") == 0) {
        return CoreType::INTERPROCESS;
    }
    if (type.compare(0, 4, "test") == 0) {
        return CoreType::TEST;
    }
    if (type.compare(0, 5, "tcpss") == 0) {
        return CoreType::TCP_SS;
    }
    if (type.compare(0, 3, "tcp") == 0) {
        return CoreType::TCP;
    }
    if (type.compare(0, 3, "udp") == 0) {
        return CoreType::UDP;
    }
    if (type.compare(0, 4, "http") == 0) {
        return CoreType::HTTP;
    }
    if (type.compare(0, 3, "mpi") == 0) {
        return CoreType::MPI;
    }
    if (type.compare(0, 6, "inproc") == 0) {
        return CoreType::INPROC;
    }
    if (type.compare(0, 3, "web") == 0) {
        return CoreType::WEBSOCKET;
    }
    if (type.compare(0, 4, "null") == 0) {
        return CoreType::NULLCORE;
    }

    return CoreType::UNRECOGNIZED;
}